

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O1

void Abc_NtkCycleInitStateSop(Abc_Ntk_t *pNtk,int nFrames,int fVerbose)

{
  void *pvVar1;
  Abc_Obj_t *pObj;
  long *plVar2;
  long lVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  long lVar9;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    srand(0x12341234);
    pVVar5 = pNtk->vPis;
    if (0 < pVVar5->nSize) {
      lVar9 = 0;
      do {
        pvVar1 = pVVar5->pArray[lVar9];
        uVar4 = rand();
        *(ulong *)((long)pvVar1 + 0x40) = (ulong)(uVar4 & 1);
        lVar9 = lVar9 + 1;
        pVVar5 = pNtk->vPis;
      } while (lVar9 < pVVar5->nSize);
    }
    pVVar5 = pNtk->vBoxes;
    if (0 < pVVar5->nSize) {
      lVar9 = 0;
      do {
        pvVar1 = pVVar5->pArray[lVar9];
        if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8) {
          *(ulong *)((long)pvVar1 + 0x40) = (ulong)(*(long *)((long)pvVar1 + 0x38) == 2);
        }
        lVar9 = lVar9 + 1;
        pVVar5 = pNtk->vBoxes;
      } while (lVar9 < pVVar5->nSize);
    }
    iVar8 = 0;
    pVVar5 = Abc_NtkDfs(pNtk,0);
    if (0 < nFrames) {
      do {
        if (0 < pVVar5->nSize) {
          lVar9 = 0;
          do {
            pObj = (Abc_Obj_t *)pVVar5->pArray[lVar9];
            aVar6._0_4_ = Abc_ObjSopSimulate(pObj);
            aVar6._4_4_ = 0;
            pObj->field_6 = aVar6;
            lVar9 = lVar9 + 1;
          } while (lVar9 < pVVar5->nSize);
        }
        pVVar7 = pNtk->vCos;
        if (0 < pVVar7->nSize) {
          lVar9 = 0;
          do {
            plVar2 = (long *)pVVar7->pArray[lVar9];
            plVar2[8] = *(long *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                           (long)*(int *)plVar2[4] * 8) + 0x40);
            lVar9 = lVar9 + 1;
            pVVar7 = pNtk->vCos;
          } while (lVar9 < pVVar7->nSize);
        }
        pVVar7 = pNtk->vPis;
        if (0 < pVVar7->nSize) {
          lVar9 = 0;
          do {
            pvVar1 = pVVar7->pArray[lVar9];
            uVar4 = rand();
            *(ulong *)((long)pvVar1 + 0x40) = (ulong)(uVar4 & 1);
            lVar9 = lVar9 + 1;
            pVVar7 = pNtk->vPis;
          } while (lVar9 < pVVar7->nSize);
        }
        pVVar7 = pNtk->vBoxes;
        if (0 < pVVar7->nSize) {
          lVar9 = 0;
          do {
            plVar2 = (long *)pVVar7->pArray[lVar9];
            if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
              lVar3 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
              *(undefined8 *)(*(long *)(lVar3 + (long)*(int *)plVar2[6] * 8) + 0x40) =
                   *(undefined8 *)(*(long *)(lVar3 + (long)*(int *)plVar2[4] * 8) + 0x40);
            }
            lVar9 = lVar9 + 1;
            pVVar7 = pNtk->vBoxes;
          } while (lVar9 < pVVar7->nSize);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != nFrames);
    }
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (void **)0x0;
    }
    if (pVVar5 != (Vec_Ptr_t *)0x0) {
      free(pVVar5);
    }
    pVVar5 = pNtk->vBoxes;
    if (0 < pVVar5->nSize) {
      lVar9 = 0;
      do {
        plVar2 = (long *)pVVar5->pArray[lVar9];
        if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
          plVar2[7] = 2 - (ulong)(*(long *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                     (long)*(int *)plVar2[6] * 8) + 0x40) == 0);
        }
        lVar9 = lVar9 + 1;
        pVVar5 = pNtk->vBoxes;
      } while (lVar9 < pVVar5->nSize);
    }
    return;
  }
  __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retInit.c"
                ,0x13f,"void Abc_NtkCycleInitStateSop(Abc_Ntk_t *, int, int)");
}

Assistant:

void Abc_NtkCycleInitStateSop( Abc_Ntk_t * pNtk, int nFrames, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, f;
    assert( Abc_NtkIsSopLogic(pNtk) );
    srand( 0x12341234 );
    // initialize the values
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)(rand() & 1);
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_LatchIsInit1(pObj);
    // simulate for the given number of timeframes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    for ( f = 0; f < nFrames; f++ )
    {
        // simulate internal nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_ObjSopSimulate( pObj );
        // bring the results to the COs
        Abc_NtkForEachCo( pNtk, pObj, i )
            pObj->pCopy = Abc_ObjFanin0(pObj)->pCopy;
        // assign PI values
        Abc_NtkForEachPi( pNtk, pObj, i )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)(rand() & 1);
        // transfer the latch values
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_ObjFanout0(pObj)->pCopy = Abc_ObjFanin0(pObj)->pCopy;
    }
    Vec_PtrFree( vNodes );
    // set the final values
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pData = (void *)(ABC_PTRUINT_T)(Abc_ObjFanout0(pObj)->pCopy ? ABC_INIT_ONE : ABC_INIT_ZERO);
}